

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nqueens.c
# Opt level: O2

void print_help(void)

{
  puts("Usage: nqueens [OPTION...] <size>\n");
  puts("  -w, --workers <workers>    Number of workers (default = 0: autodetect)");
  puts("      --report-minor         Report minor steps");
  puts("      --report-minterms      Report #minterms at every major step");
  puts("      --report-stats         Report statistics at end");
  puts("  -h, --help                 Give this help list");
  puts("      --usage                Give a short usage message");
  return;
}

Assistant:

static void
print_help()
{
    printf("Usage: nqueens [OPTION...] <size>\n\n");
    printf("  -w, --workers <workers>    Number of workers (default = 0: autodetect)\n");
    printf("      --report-minor         Report minor steps\n");
    printf("      --report-minterms      Report #minterms at every major step\n");
    printf("      --report-stats         Report statistics at end\n");
    printf("  -h, --help                 Give this help list\n");
    printf("      --usage                Give a short usage message\n");
}